

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O1

void cftmdl1(int n,double *a,double *w)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  
  uVar7 = n >> 3;
  uVar3 = uVar7 * 2;
  dVar18 = *a + a[(int)(uVar7 * 4)];
  iVar1 = uVar7 * 4 + 1;
  dVar19 = a[1] + a[iVar1];
  dVar16 = *a - a[(int)(uVar7 * 4)];
  dVar15 = a[1] - a[iVar1];
  dVar20 = a[(int)uVar3] + a[(int)(uVar7 * 6)];
  iVar2 = uVar7 * 2 + 1;
  iVar10 = uVar7 * 6 + 1;
  dVar24 = a[iVar2] + a[iVar10];
  dVar17 = a[(int)uVar3] - a[(int)(uVar7 * 6)];
  dVar22 = a[iVar2] - a[iVar10];
  *a = dVar18 + dVar20;
  a[1] = dVar19 + dVar24;
  a[(int)uVar3] = dVar18 - dVar20;
  a[iVar2] = dVar19 - dVar24;
  a[(int)(uVar7 * 4)] = dVar16 - dVar22;
  a[iVar1] = dVar15 + dVar17;
  a[(int)(uVar7 * 6)] = dVar22 + dVar16;
  a[iVar10] = dVar15 - dVar17;
  dVar15 = w[1];
  if (2 < (int)uVar7) {
    uVar14 = (ulong)uVar3;
    pdVar5 = w + 7;
    lVar8 = uVar14 - 1;
    lVar11 = uVar14 * 0x10 + -8;
    lVar12 = uVar14 * 0x18 + -8;
    lVar6 = uVar14 * 0x20 + -8;
    lVar4 = uVar14 + 3;
    lVar9 = uVar14 * 0x10 + 0x18;
    lVar13 = uVar14 * 0x18 + 0x18;
    uVar14 = 2;
    do {
      dVar16 = pdVar5[-3];
      dVar17 = pdVar5[-2];
      dVar18 = pdVar5[-1];
      dVar19 = *pdVar5;
      dVar20 = *(double *)((long)a + lVar9 + -8);
      dVar23 = a[uVar14] - dVar20;
      dVar24 = a[uVar14 + 1] - *(double *)((long)a + lVar9);
      dVar20 = a[uVar14] + dVar20;
      dVar22 = *(double *)((long)a + lVar13 + -8);
      dVar25 = a[uVar14 + 1] + *(double *)((long)a + lVar9);
      dVar26 = a[lVar4 + -1] + dVar22;
      dVar29 = a[lVar4] + *(double *)((long)a + lVar13);
      dVar22 = a[lVar4 + -1] - dVar22;
      dVar21 = a[lVar4] - *(double *)((long)a + lVar13);
      a[uVar14] = dVar20 + dVar26;
      dVar27 = dVar23 - dVar21;
      a[uVar14 + 1] = dVar25 + dVar29;
      dVar28 = dVar24 + dVar22;
      a[lVar4 + -1] = dVar20 - dVar26;
      a[lVar4] = dVar25 - dVar29;
      dVar21 = dVar21 + dVar23;
      dVar24 = dVar24 - dVar22;
      *(double *)((long)a + lVar9 + -8) = dVar16 * dVar27 - dVar28 * dVar17;
      *(double *)((long)a + lVar9) = dVar27 * dVar17 + dVar16 * dVar28;
      *(double *)((long)a + lVar13 + -8) = dVar18 * dVar21 + dVar19 * dVar24;
      *(double *)((long)a + lVar13) = dVar24 * dVar18 - dVar21 * dVar19;
      dVar20 = *(double *)((long)a + lVar12 + -8);
      dVar23 = a[lVar8 + -1] - dVar20;
      dVar21 = a[lVar8] - *(double *)((long)a + lVar12);
      dVar22 = *(double *)((long)a + lVar11 + -8);
      dVar20 = a[lVar8 + -1] + dVar20;
      dVar24 = *(double *)((long)a + lVar6 + -8);
      dVar25 = a[lVar8] + *(double *)((long)a + lVar12);
      dVar26 = dVar22 + dVar24;
      dVar27 = *(double *)((long)a + lVar11) + *(double *)((long)a + lVar6);
      dVar22 = dVar22 - dVar24;
      dVar24 = *(double *)((long)a + lVar11) - *(double *)((long)a + lVar6);
      a[lVar8 + -1] = dVar20 + dVar26;
      a[lVar8] = dVar25 + dVar27;
      *(double *)((long)a + lVar11 + -8) = dVar20 - dVar26;
      dVar26 = dVar23 - dVar24;
      dVar20 = dVar21 + dVar22;
      *(double *)((long)a + lVar11) = dVar25 - dVar27;
      dVar24 = dVar24 + dVar23;
      dVar21 = dVar21 - dVar22;
      *(double *)((long)a + lVar12 + -8) = dVar17 * dVar26 - dVar20 * dVar16;
      *(double *)((long)a + lVar12) = dVar20 * dVar17 + dVar26 * dVar16;
      *(double *)((long)a + lVar6 + -8) = dVar19 * dVar24 + dVar18 * dVar21;
      uVar14 = uVar14 + 2;
      pdVar5 = pdVar5 + 4;
      *(double *)((long)a + lVar6) = dVar21 * dVar19 - dVar24 * dVar18;
      lVar8 = lVar8 + -2;
      lVar11 = lVar11 + -0x10;
      lVar12 = lVar12 + -0x10;
      lVar6 = lVar6 + -0x10;
      lVar4 = lVar4 + 2;
      lVar9 = lVar9 + 0x10;
      lVar13 = lVar13 + 0x10;
    } while (uVar14 < uVar7);
  }
  lVar11 = (long)(int)(uVar7 * 5);
  dVar20 = a[(int)uVar7] + a[lVar11];
  dVar22 = a[(long)(int)uVar7 + 1] + a[lVar11 + 1];
  dVar17 = a[(int)uVar7] - a[lVar11];
  dVar16 = a[(long)(int)uVar7 + 1] - a[lVar11 + 1];
  lVar4 = (long)(int)(uVar7 * 3);
  lVar8 = (long)(int)(uVar7 * 7);
  dVar24 = a[lVar4] + a[lVar8];
  dVar21 = a[lVar4 + 1] + a[lVar8 + 1];
  dVar19 = a[lVar4] - a[lVar8];
  dVar18 = a[lVar4 + 1] - a[lVar8 + 1];
  a[(int)uVar7] = dVar20 + dVar24;
  a[(long)(int)uVar7 + 1] = dVar22 + dVar21;
  a[lVar4] = dVar20 - dVar24;
  a[lVar4 + 1] = dVar22 - dVar21;
  dVar20 = dVar17 - dVar18;
  dVar22 = dVar16 + dVar19;
  a[lVar11] = (dVar20 - dVar22) * dVar15;
  a[lVar11 + 1] = (dVar22 + dVar20) * dVar15;
  dVar18 = dVar18 + dVar17;
  dVar16 = dVar16 - dVar19;
  a[lVar8] = (dVar16 + dVar18) * -dVar15;
  a[lVar8 + 1] = (dVar16 - dVar18) * -dVar15;
  return;
}

Assistant:

void cftmdl1(int n, double *a, double *w) {
  int j, j0, j1, j2, j3, k, m, mh;
  double wn4r, wk1r, wk1i, wk3r, wk3i;
  double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

  mh = n >> 3;
  m = 2 * mh;
  j1 = m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[0] + a[j2];
  x0i = a[1] + a[j2 + 1];
  x1r = a[0] - a[j2];
  x1i = a[1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[0] = x0r + x2r;
  a[1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  a[j2] = x1r - x3i;
  a[j2 + 1] = x1i + x3r;
  a[j3] = x1r + x3i;
  a[j3 + 1] = x1i - x3r;
  wn4r = w[1];
  k = 0;
  for (j = 2; j < mh; j += 2) {
    k += 4;
    wk1r = w[k];
    wk1i = w[k + 1];
    wk3r = w[k + 2];
    wk3i = w[k + 3];
    j1 = j + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j] + a[j2];
    x0i = a[j + 1] + a[j2 + 1];
    x1r = a[j] - a[j2];
    x1i = a[j + 1] - a[j2 + 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    a[j] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1r * x0r - wk1i * x0i;
    a[j2 + 1] = wk1r * x0i + wk1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3r * x0r + wk3i * x0i;
    a[j3 + 1] = wk3r * x0i - wk3i * x0r;
    j0 = m - j;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] + a[j2];
    x0i = a[j0 + 1] + a[j2 + 1];
    x1r = a[j0] - a[j2];
    x1i = a[j0 + 1] - a[j2 + 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    a[j0] = x0r + x2r;
    a[j0 + 1] = x0i + x2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1i * x0r - wk1r * x0i;
    a[j2 + 1] = wk1i * x0i + wk1r * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3i * x0r + wk3r * x0i;
    a[j3 + 1] = wk3i * x0i - wk3r * x0r;
  }
  j0 = mh;
  j1 = j0 + m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[j0] + a[j2];
  x0i = a[j0 + 1] + a[j2 + 1];
  x1r = a[j0] - a[j2];
  x1i = a[j0 + 1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[j0] = x0r + x2r;
  a[j0 + 1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[j2] = wn4r * (x0r - x0i);
  a[j2 + 1] = wn4r * (x0i + x0r);
  x0r = x1r + x3i;
  x0i = x1i - x3r;
  a[j3] = -wn4r * (x0r + x0i);
  a[j3 + 1] = -wn4r * (x0i - x0r);
}